

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

bool anon_unknown.dwarf_b837c::IsLookupOnlyVariable(ExpressionContext *ctx,VariableData *variable)

{
  bool bVar1;
  FunctionData *function;
  FunctionData *pFVar2;
  
  function = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
  pFVar2 = ExpressionContext::GetFunctionOwner(ctx,variable->scope);
  if (pFVar2 != (FunctionData *)0x0 && function != (FunctionData *)0x0) {
    if (pFVar2 != function) {
      return true;
    }
    if ((function->coroutine == true) && (bVar1 = IsArgumentVariable(function,variable), !bVar1)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool IsLookupOnlyVariable(ExpressionContext &ctx, VariableData *variable)
	{
		FunctionData *currentFunction = ctx.GetCurrentFunction(ctx.scope);
		FunctionData *variableFunctionOwner = ctx.GetFunctionOwner(variable->scope);

		if(currentFunction && variableFunctionOwner)
		{
			if(variableFunctionOwner != currentFunction)
				return true;

			if(currentFunction->coroutine && !IsArgumentVariable(currentFunction, variable))
				return true;
		}

		return false;
	}